

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
          (SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *this,Shader *ptr)

{
  Shader *pSVar1;
  SharedPtrState<deqp::egl::GLES2ThreadTest::Shader,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::Shader>_>
  *pSVar2;
  DefaultDeleter<deqp::egl::GLES2ThreadTest::Shader> local_25 [13];
  Shader *local_18;
  Shader *ptr_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *this_local;
  
  this->m_ptr = (Shader *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (Shader *)this;
  pSVar2 = (SharedPtrState<deqp::egl::GLES2ThreadTest::Shader,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::Shader>_>
            *)operator_new(0x20);
  pSVar1 = local_18;
  DefaultDeleter<deqp::egl::GLES2ThreadTest::Shader>::DefaultDeleter(local_25);
  SharedPtrState<deqp::egl::GLES2ThreadTest::Shader,_de::DefaultDeleter<deqp::egl::GLES2ThreadTest::Shader>_>
  ::SharedPtrState(pSVar2,pSVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}